

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

int __thiscall btHashString::portableStringCompare(btHashString *this,char *src,char *dst)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  lVar4 = 0;
  while( true ) {
    bVar1 = src[lVar4];
    bVar2 = dst[lVar4];
    if ((bVar1 != bVar2) || (bVar2 == 0)) break;
    lVar4 = lVar4 + 1;
  }
  iVar5 = 1;
  if (bVar1 == bVar2) {
    iVar5 = (uint)bVar1 - (uint)bVar2;
  }
  iVar3 = -1;
  if (-1 < (int)((uint)bVar1 - (uint)bVar2)) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

int portableStringCompare(const char* src,	const char* dst) const
	{
			int ret = 0 ;

			while( ! (ret = *(unsigned char *)src - *(unsigned char *)dst) && *dst)
					++src, ++dst;

			if ( ret < 0 )
					ret = -1 ;
			else if ( ret > 0 )
					ret = 1 ;

			return( ret );
	}